

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

CURLcode add_file_name_to_url(CURL *curl,char **inurlp,char *filename)

{
  CURLUcode ucode;
  CURLcode CVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  void *__ptr;
  char *pcVar7;
  char *path;
  char *query;
  char *local_40;
  char *newurl;
  
  lVar3 = curl_url();
  path = (char *)0x0;
  query = (char *)0x0;
  CVar1 = CURLE_URL_MALFORMAT;
  if (lVar3 == 0) goto LAB_00119b4a;
  ucode = curl_url_set(lVar3,0,*inurlp,0x208);
  if ((ucode == CURLUE_OK) && (ucode = curl_url_get(lVar3,7,&path,0), ucode == CURLUE_OK)) {
    iVar2 = curl_url_get(lVar3,8,&query,0);
    if (query != (char *)0x0 && iVar2 == 0) {
      curl_free();
      curl_free(path);
      curl_url_cleanup(lVar3);
      return CURLE_OK;
    }
    pcVar4 = strrchr(path,0x2f);
    if ((pcVar4 != (char *)0x0) && (CVar1 = CURLE_OK, pcVar4[1] != '\0')) goto LAB_00119b4a;
    local_40 = pcVar4;
    pcVar4 = strrchr(filename,0x2f);
    pcVar7 = pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar7 = filename;
      pcVar4 = filename;
    }
    pcVar5 = strrchr(pcVar4,0x5c);
    pcVar4 = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar4 = pcVar7;
    }
    lVar6 = curl_easy_escape(curl,pcVar4,0);
    CVar1 = CURLE_URL_MALFORMAT;
    if (lVar6 == 0) goto LAB_00119b4a;
    pcVar4 = "%s%s";
    if (local_40 == (char *)0x0) {
      pcVar4 = "%s/%s";
    }
    __ptr = (void *)curl_maprintf(pcVar4,path,lVar6);
    curl_free(lVar6);
    if (__ptr == (void *)0x0) {
      CVar1 = CURLE_URL_MALFORMAT;
      goto LAB_00119b4a;
    }
    ucode = curl_url_set(lVar3,7,__ptr,0);
    free(__ptr);
    if (ucode == CURLUE_OK) {
      ucode = curl_url_get(lVar3,0,&newurl,4);
      if (ucode == CURLUE_OK) {
        free(*inurlp);
        *inurlp = newurl;
        CVar1 = CURLE_OK;
        goto LAB_00119b4a;
      }
    }
  }
  CVar1 = urlerr_cvt(ucode);
LAB_00119b4a:
  curl_url_cleanup(lVar3);
  curl_free(path);
  return CVar1;
}

Assistant:

CURLcode add_file_name_to_url(CURL *curl, char **inurlp, const char *filename)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode uerr;
  CURLU *uh = curl_url();
  char *path = NULL;
  char *query = NULL;
  if(uh) {
    char *ptr;
    uerr = curl_url_set(uh, CURLUPART_URL, *inurlp,
                    CURLU_GUESS_SCHEME|CURLU_NON_SUPPORT_SCHEME);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_QUERY, &query, 0);
    if(!uerr && query) {
      curl_free(query);
      curl_free(path);
      curl_url_cleanup(uh);
      return CURLE_OK;
    }
    ptr = strrchr(path, '/');
    if(!ptr || !*++ptr) {
      /* The URL path has no filename part, add the local filename. In order
         to be able to do so, we have to create a new URL in another buffer.*/

      /* We only want the part of the local path that is on the right
         side of the rightmost slash and backslash. */
      const char *filep = strrchr(filename, '/');
      char *file2 = strrchr(filep ? filep : filename, '\\');
      char *encfile;

      if(file2)
        filep = file2 + 1;
      else if(filep)
        filep++;
      else
        filep = filename;

      /* URL encode the filename */
      encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
      if(encfile) {
        char *newpath;
        char *newurl;
        if(ptr)
          /* there is a trailing slash on the path */
          newpath = aprintf("%s%s", path, encfile);
        else
          /* there is no trailing slash on the path */
          newpath = aprintf("%s/%s", path, encfile);

        curl_free(encfile);

        if(!newpath)
          goto fail;
        uerr = curl_url_set(uh, CURLUPART_PATH, newpath, 0);
        free(newpath);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        uerr = curl_url_get(uh, CURLUPART_URL, &newurl, CURLU_DEFAULT_SCHEME);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        free(*inurlp);
        *inurlp = newurl;
        result = CURLE_OK;
      }
    }
    else
      /* nothing to do */
      result = CURLE_OK;
  }
fail:
  curl_url_cleanup(uh);
  curl_free(path);
  return result;
}